

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrNSImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMAttrNSImpl::DOMAttrNSImpl
          (DOMAttrNSImpl *this,DOMDocument *ownerDoc,XMLCh *namespaceURI,XMLCh *prefix,
          XMLCh *localName,XMLCh *qualifiedName)

{
  DOMDocument *pDVar1;
  XMLCh *pXVar2;
  XMLCh *local_a0;
  XMLCh *local_90;
  DOMDocumentImpl *local_70;
  XMLCh *URI;
  DOMDocumentImpl *docImpl;
  XMLCh *qualifiedName_local;
  XMLCh *localName_local;
  XMLCh *prefix_local;
  XMLCh *namespaceURI_local;
  DOMDocument *ownerDoc_local;
  DOMAttrNSImpl *this_local;
  
  DOMAttrImpl::DOMAttrImpl(&this->super_DOMAttrImpl,ownerDoc,qualifiedName);
  (this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode =
       (_func_int **)&PTR__DOMAttrNSImpl_00527618;
  (this->super_DOMAttrImpl).super_HasDOMNodeImpl._vptr_HasDOMNodeImpl =
       (_func_int **)&PTR__DOMAttrNSImpl_005277f0;
  (this->super_DOMAttrImpl).super_HasDOMParentImpl._vptr_HasDOMParentImpl =
       (_func_int **)&PTR__DOMAttrNSImpl_00527820;
  pDVar1 = (this->super_DOMAttrImpl).fParent.fOwnerDocument;
  if (pDVar1 == (DOMDocument *)0x0) {
    local_70 = (DOMDocumentImpl *)0x0;
  }
  else {
    local_70 = (DOMDocumentImpl *)&pDVar1[-1].super_DOMNode;
  }
  if ((prefix == (XMLCh *)0x0) || (*prefix == L'\0')) {
    this->fPrefix = (XMLCh *)0x0;
    this->fLocalName = (this->super_DOMAttrImpl).fName;
  }
  else {
    pXVar2 = DOMDocumentImpl::getPooledString(local_70,prefix);
    this->fPrefix = pXVar2;
    pXVar2 = DOMDocumentImpl::getPooledString(local_70,localName);
    this->fLocalName = pXVar2;
  }
  if ((namespaceURI == (XMLCh *)0x0) || (local_90 = namespaceURI, *namespaceURI == L'\0')) {
    local_90 = (XMLCh *)0x0;
  }
  pXVar2 = DOMNodeImpl::mapPrefix(this->fPrefix,local_90,2);
  if (pXVar2 == (XMLCh *)0x0) {
    local_a0 = (XMLCh *)0x0;
  }
  else {
    local_a0 = DOMDocumentImpl::getPooledString(local_70,pXVar2);
  }
  this->fNamespaceURI = local_a0;
  return;
}

Assistant:

DOMAttrNSImpl::
DOMAttrNSImpl(DOMDocument *ownerDoc,
              const XMLCh *namespaceURI,
              const XMLCh *prefix,
              const XMLCh *localName,
              const XMLCh *qualifiedName)
    : DOMAttrImpl(ownerDoc, qualifiedName)
{
  DOMDocumentImpl* docImpl = (DOMDocumentImpl*)fParent.fOwnerDocument;

  if (prefix == 0 || *prefix == 0)
  {
    fPrefix = 0;
    fLocalName = fName;
  }
  else
  {
    fPrefix = docImpl->getPooledString(prefix);
    fLocalName = docImpl->getPooledString(localName);
  }

  // DOM Level 3: namespace URI is never empty string.
  //
  const XMLCh * URI = DOMNodeImpl::mapPrefix
    (
      fPrefix,
      (!namespaceURI || !*namespaceURI) ? 0 : namespaceURI,
      DOMNode::ATTRIBUTE_NODE
    );
  this -> fNamespaceURI = (URI == 0) ? 0 : docImpl->getPooledString(URI);
}